

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::Encode(GaussianPuffRecord *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_PuffLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_PuffLocation,stream);
  (*(this->m_OrigLocation).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_OrigLocation,stream);
  (*(this->m_Sigma).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Sigma,stream);
  (*(this->m_DDTSigma).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DDTSigma,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32CentHeight);
  return;
}

Assistant:

void GaussianPuffRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_PuffLocation
           << KDIS_STREAM m_OrigLocation
           << KDIS_STREAM m_Sigma
           << KDIS_STREAM m_DDTSigma
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32CentHeight;
}